

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

string * __thiscall
cs_impl::any::holder<cs::range_type>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,holder<cs::range_type> *this)

{
  bool bVar1;
  string str;
  numeric it;
  range_iterator __begin1;
  range_iterator __end1;
  _Alloc_hider local_138;
  size_type local_130;
  char local_128;
  undefined7 uStack_127;
  undefined8 uStack_120;
  anon_union_16_2_310e9938_for_data local_118;
  undefined1 local_108;
  anon_union_16_2_310e9938_for_data local_f8;
  undefined1 local_e8;
  anon_union_16_2_310e9938_for_data local_d8;
  undefined1 local_c8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  numeric_integer local_78;
  undefined8 uStack_70;
  undefined1 local_68;
  anon_union_16_2_310e9938_for_data local_58;
  undefined1 local_48;
  
  bVar1 = cs::range_type::empty(&this->mDat);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"cs::range => {}",(allocator *)&local_f8);
  }
  else {
    std::__cxx11::string::string((string *)&local_138,"cs::range => {",(allocator *)&local_f8);
    local_f8._int = (this->mDat).m_step.data._int;
    local_f8._8_8_ = *(undefined8 *)((long)&(this->mDat).m_step.data + 8);
    local_e8 = (this->mDat).m_step.type;
    local_d8._int = (this->mDat).m_start.data._int;
    local_d8._8_8_ = *(undefined8 *)((long)&(this->mDat).m_start.data + 8);
    local_c8 = (this->mDat).m_start.type;
    local_78 = (this->mDat).m_step.data._int;
    uStack_70 = *(undefined8 *)((long)&(this->mDat).m_step.data + 8);
    local_58._int = (this->mDat).m_stop.data._int;
    local_58._8_8_ = *(undefined8 *)((long)&(this->mDat).m_stop.data + 8);
    local_48 = (this->mDat).m_stop.type;
    local_68 = local_e8;
    while( true ) {
      bVar1 = cs::numeric::operator<((numeric *)&local_d8,(numeric *)&local_58);
      if (!bVar1) break;
      local_118._int = local_d8._int;
      local_118._8_8_ = local_d8._8_8_;
      local_108 = local_c8;
      to_string<cs::numeric>(&local_b8,(numeric *)&local_118);
      std::operator+(&local_98,&local_b8,", ");
      std::__cxx11::string::append((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      cs::range_iterator::operator++((range_iterator *)&local_f8);
    }
    std::__cxx11::string::resize((ulong)&local_138);
    std::__cxx11::string::append((char *)&local_138);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_138._M_p == &local_128) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_127,local_128);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_120;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_138._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_127,local_128);
    }
    __return_storage_ptr__->_M_string_length = local_130;
    local_130 = 0;
    local_128 = '\0';
    local_138._M_p = &local_128;
    std::__cxx11::string::~string((string *)&local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}